

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O2

void __thiscall OrPattern::~OrPattern(OrPattern *this)

{
  pointer ppDVar1;
  
  (this->super_Pattern)._vptr_Pattern = (_func_int **)&PTR__OrPattern_00401278;
  for (ppDVar1 = (this->orlist).
                 super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppDVar1 !=
      (this->orlist).super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppDVar1 = ppDVar1 + 1) {
    if (*ppDVar1 != (DisjointPattern *)0x0) {
      (*((*ppDVar1)->super_Pattern)._vptr_Pattern[1])();
    }
  }
  std::_Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::~_Vector_base
            (&(this->orlist).
              super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>);
  return;
}

Assistant:

OrPattern::~OrPattern(void)

{
  vector<DisjointPattern *>::iterator iter;

  for(iter=orlist.begin();iter!=orlist.end();++iter)
    delete *iter;
}